

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O1

bool __thiscall ON_Extrusion::GetProfilePlane(ON_Extrusion *this,double s,ON_Plane *plane)

{
  ON_Line *this_00;
  ON_3dVector *a;
  double dVar1;
  bool bVar2;
  long lVar3;
  ON_Plane *pOVar4;
  ON_Plane *pOVar5;
  byte bVar6;
  ON_3dVector T;
  ON_Plane p;
  ON_Xform local_138;
  ON_Plane local_b8;
  
  bVar6 = 0;
  ON_Plane::ON_Plane(&local_b8);
  local_b8.origin.z = ON_3dPoint::Origin.z;
  local_b8.origin.x = ON_3dPoint::Origin.x;
  local_b8.origin.y = ON_3dPoint::Origin.y;
  local_138.m_xform[0][2] = ON_3dVector::UnsetVector.z;
  local_138.m_xform[0][0] = ON_3dVector::UnsetVector.x;
  local_138.m_xform[0][1] = ON_3dVector::UnsetVector.y;
  this_00 = &this->m_path;
  bVar2 = ON_Line::IsValid(this_00);
  if (bVar2) {
    ON_Line::Tangent((ON_3dVector *)&local_138,this_00);
  }
  local_b8.zaxis.z = local_138.m_xform[0][2];
  local_b8.zaxis.x = local_138.m_xform[0][0];
  local_b8.zaxis.y = local_138.m_xform[0][1];
  a = &local_b8.yaxis;
  local_b8.yaxis.x = (this->m_up).x;
  local_b8.yaxis.y = (this->m_up).y;
  local_b8.yaxis.z = (this->m_up).z;
  ON_CrossProduct((ON_3dVector *)&local_138,a,&local_b8.zaxis);
  local_b8.xaxis.z = local_138.m_xform[0][2];
  local_b8.xaxis.x = local_138.m_xform[0][0];
  local_b8.xaxis.y = local_138.m_xform[0][1];
  bVar2 = ON_3dVector::Unitize(&local_b8.xaxis);
  if (bVar2) {
    bVar2 = ON_3dVector::Unitize(a);
    if (bVar2) {
      ON_Plane::UpdateEquation(&local_b8);
      bVar2 = ON_Plane::IsValid(&local_b8);
      if (!bVar2) {
        ON_CrossProduct((ON_3dVector *)&local_138,&local_b8.zaxis,&local_b8.xaxis);
        local_b8.yaxis.z = local_138.m_xform[0][2];
        local_b8.yaxis.x = local_138.m_xform[0][0];
        local_b8.yaxis.y = local_138.m_xform[0][1];
        ON_3dVector::Unitize(a);
        bVar2 = ON_Plane::IsValid(&local_b8);
        if (!bVar2) goto LAB_003c60ad;
      }
      if (((this->m_bHaveN[0] != true) ||
          ((((dVar1 = this->m_N[0].x, dVar1 == 0.0 && (!NAN(dVar1))) &&
            (dVar1 = this->m_N[0].y, dVar1 == 0.0)) && (!NAN(dVar1))))) &&
         ((this->m_bHaveN[1] != true ||
          (((dVar1 = this->m_N[1].x, dVar1 == 0.0 && (!NAN(dVar1))) &&
           ((dVar1 = this->m_N[1].y, dVar1 == 0.0 && (!NAN(dVar1))))))))) {
        dVar1 = ON_Interval::ParameterAt(&this->m_t,s);
        ON_Line::PointAt((ON_3dPoint *)&local_138,this_00,dVar1);
        local_b8.origin.z = local_138.m_xform[0][2];
        local_b8.origin.x = local_138.m_xform[0][0];
        local_b8.origin.y = local_138.m_xform[0][1];
        ON_Plane::UpdateEquation(&local_b8);
LAB_003c6057:
        pOVar4 = &local_b8;
        pOVar5 = plane;
        for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
          (pOVar5->origin).x = (pOVar4->origin).x;
          pOVar4 = (ON_Plane *)((long)pOVar4 + ((ulong)bVar6 * -2 + 1) * 8);
          pOVar5 = (ON_Plane *)((long)pOVar5 + (ulong)bVar6 * -0x10 + 8);
        }
        bVar2 = ON_Plane::IsValid(plane);
        goto LAB_003c60af;
      }
      ON_Xform::ON_Xform(&local_138);
      bVar2 = GetProfileTransformation(this,s,&local_138);
      if (bVar2) {
        bVar2 = ON_Plane::Transform(&local_b8,&local_138);
        if (bVar2) goto LAB_003c6057;
      }
    }
  }
LAB_003c60ad:
  bVar2 = false;
LAB_003c60af:
  ON_Plane::~ON_Plane(&local_b8);
  return bVar2;
}

Assistant:

bool ON_Extrusion::GetProfilePlane( double s, ON_Plane& plane ) const
{
  ON_Plane p;
  p.origin = ON_3dPoint::Origin;
  p.zaxis = PathTangent();
  p.yaxis = m_up;
  p.xaxis = ON_CrossProduct(p.yaxis,p.zaxis);
  if ( !p.xaxis.Unitize() )
    return false;
  if ( !p.yaxis.Unitize() )
    return false;
  p.UpdateEquation();
  if ( !p.IsValid() )
  {
    p.yaxis = ON_CrossProduct(p.zaxis,p.xaxis);
    p.yaxis.Unitize();
    if ( !p.IsValid() )
      return false;
  }
  if (    (!m_bHaveN[0] || (0.0 == m_N[0].x && 0.0 == m_N[0].y)) 
       && (!m_bHaveN[1] || (0.0 == m_N[1].x && 0.0 == m_N[1].y)) 
     )
  {
    p.origin = m_path.PointAt(m_t.ParameterAt(s));
    p.UpdateEquation();
    plane = p;
  }
  else
  {
    ON_Xform xform;
    if ( !GetProfileTransformation(s,xform) )
      return false;
    if (!p.Transform(xform))
      return false;
    plane = p;
  }
  return plane.IsValid();
}